

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int boost::filesystem::detail::lex_compare
              (iterator *first1,iterator *last1,iterator *first2,iterator *last2)

{
  type tVar1;
  bool bVar2;
  __type _Var3;
  pointer ppVar4;
  string_type *psVar5;
  string_type *psVar6;
  type local_51;
  iterator *last2_local;
  iterator *first2_local;
  iterator *last1_local;
  iterator *first1_local;
  
  while( true ) {
    tVar1 = iterators::operator!=
                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)first1,
                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                        *)last1);
    local_51 = false;
    if (tVar1) {
      local_51 = iterators::operator!=
                           ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                             *)first2,
                            (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                             *)last2);
    }
    if (local_51 == false) {
      tVar1 = iterators::operator==
                        ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                          *)first1,
                         (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                          *)last1);
      if ((tVar1) &&
         (tVar1 = iterators::operator==
                            ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)first2,
                             (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)last2), tVar1)) {
        first1_local._4_4_ = 0;
      }
      else {
        tVar1 = iterators::operator==
                          ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)first1,
                           (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                            *)last1);
        first1_local._4_4_ = 1;
        if (tVar1) {
          first1_local._4_4_ = -1;
        }
      }
      return first1_local._4_4_;
    }
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first1);
    psVar5 = filesystem::path::native_abi_cxx11_(ppVar4);
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first2);
    psVar6 = filesystem::path::native_abi_cxx11_(ppVar4);
    bVar2 = std::operator<(psVar5,psVar6);
    if (bVar2) {
      return -1;
    }
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first2);
    psVar5 = filesystem::path::native_abi_cxx11_(ppVar4);
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first1);
    psVar6 = filesystem::path::native_abi_cxx11_(ppVar4);
    bVar2 = std::operator<(psVar5,psVar6);
    if (bVar2) break;
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first2);
    psVar5 = filesystem::path::native_abi_cxx11_(ppVar4);
    ppVar4 = iterators::detail::
             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                           *)first1);
    psVar6 = filesystem::path::native_abi_cxx11_(ppVar4);
    _Var3 = std::operator==(psVar5,psVar6);
    if (!_Var3) {
      __assert_fail("first2->native() == first1->native()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                    ,699,
                    "int boost::filesystem::detail::lex_compare(path::iterator, path::iterator, path::iterator, path::iterator)"
                   );
    }
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  *)first1);
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  *)first2);
  }
  return 1;
}

Assistant:

BOOST_FILESYSTEM_DECL
      int lex_compare(path::iterator first1, path::iterator last1,
        path::iterator first2, path::iterator last2)
    {
      for (; first1 != last1 && first2 != last2;)
      {
        if (first1->native() < first2->native()) return -1;
        if (first2->native() < first1->native()) return 1;
        BOOST_ASSERT(first2->native() == first1->native());
        ++first1;
        ++first2;
      }
      if (first1 == last1 && first2 == last2)
        return 0;
      return first1 == last1 ? -1 : 1;
    }